

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr fmt::BasicWriter<char>::fill_padding
                  (CharPtr buffer,uint total_size,size_t content_size,wchar_t fill)

{
  CharPtr pcVar1;
  CharPtr content;
  ulong uStack_38;
  char fill_char;
  size_t left_padding;
  size_t padding;
  size_t sStack_20;
  wchar_t fill_local;
  size_t content_size_local;
  CharPtr pcStack_10;
  uint total_size_local;
  CharPtr buffer_local;
  
  left_padding = total_size - content_size;
  uStack_38 = left_padding >> 1;
  padding._4_4_ = fill;
  sStack_20 = content_size;
  content_size_local._4_4_ = total_size;
  pcStack_10 = buffer;
  content._7_1_ = internal::BasicCharTraits<char>::cast(fill);
  std::uninitialized_fill_n<char*,unsigned_long,char>
            (pcStack_10,uStack_38,(char *)((long)&content + 7));
  pcVar1 = pcStack_10 + uStack_38;
  pcStack_10 = pcVar1;
  std::uninitialized_fill_n<char*,unsigned_long,char>
            (pcVar1 + sStack_20,left_padding - uStack_38,(char *)((long)&content + 7));
  return pcVar1;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::fill_padding(
    CharPtr buffer, unsigned total_size, std::size_t content_size, wchar_t fill)
{
    std::size_t padding = total_size - content_size;
    std::size_t left_padding = padding / 2;
    Char fill_char = internal::CharTraits<Char>::cast(fill);
    std::uninitialized_fill_n(buffer, left_padding, fill_char);
    buffer += left_padding;
    CharPtr content = buffer;
    std::uninitialized_fill_n(buffer + content_size, padding - left_padding, fill_char);
    return content;
}